

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

_Bool sysbvm_io_writeWholeFileNamedWithByteArray(sysbvm_tuple_t filename,sysbvm_tuple_t content)

{
  char *__filename;
  FILE *__s;
  size_t sVar1;
  bool bVar2;
  _Bool _Var3;
  
  __filename = sysbvm_tuple_bytesToCString(filename);
  __s = fopen(__filename,"wb");
  if (__s == (FILE *)0x0) {
    _Var3 = false;
  }
  else {
    sysbvm_tuple_bytesToCStringFree(__filename);
    bVar2 = (content & 0xf) != 0;
    _Var3 = true;
    if ((!bVar2 && content != 0) && ((*(uint *)(content + 8) & 0x300) == 0x200)) {
      if (bVar2 || content == 0) {
        sVar1 = 0;
      }
      else {
        sVar1 = (size_t)*(uint *)(content + 0xc);
      }
      sVar1 = fwrite((void *)(content + 0x10),sVar1,1,__s);
      _Var3 = sVar1 == 1;
    }
    fclose(__s);
  }
  return _Var3;
}

Assistant:

SYSBVM_API bool sysbvm_io_writeWholeFileNamedWithByteArray(sysbvm_tuple_t filename, sysbvm_tuple_t content)
{
    char *outputFileName = sysbvm_tuple_bytesToCString(filename);
#ifdef _WIN32
    FILE *outputFile = NULL;
    if(fopen_s(&outputFile, outputFileName, "wb"))
        return false;
#else
    FILE *outputFile = fopen(outputFileName, "wb");
#endif
    if(!outputFile)
        return false;
    sysbvm_tuple_bytesToCStringFree(outputFileName);

    bool success = true;
    if(sysbvm_tuple_isBytes(content))
    {
        size_t contentSize = sysbvm_tuple_getSizeInBytes(content);
        success = fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(content)->bytes, contentSize, 1, outputFile) == 1;
    }
    fclose(outputFile);

    return success;
}